

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQOuter::Finalize(SQOuter *this)

{
  ::SQObjectPtr::Null((SQObjectPtr *)this);
  return;
}

Assistant:

void Finalize() { _value.Null(); }